

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffgr4b(fitsfile *fptr,LONGLONG byteloc,long nvals,long incre,float *values,int *status)

{
  LONGLONG LVar1;
  
  if (incre == 4) {
    if (nvals < 0x870) {
      ffmbyt(fptr,byteloc,0,status);
      ffgbyt(fptr,nvals * 4,values,status);
    }
    else {
      LVar1 = fptr->Fptr->bytepos;
      fptr->Fptr->bytepos = byteloc;
      ffgbyt(fptr,nvals * 4,values,status);
      fptr->Fptr->bytepos = LVar1;
    }
  }
  else {
    ffmbyt(fptr,byteloc,0,status);
    ffgbytoff(fptr,4,nvals,incre + -4,values,status);
  }
  ffswap4((int *)values,nvals);
  return *status;
}

Assistant:

int ffgr4b(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG byteloc,   /* I - position within file to start reading    */
           long nvals,      /* I - number of pixels to read                 */
           long incre,      /* I - byte increment between pixels            */
           float *values,   /* O - returned array of values                 */
           int *status)     /* IO - error status                            */
/*
  get (read) the array of values from the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
    LONGLONG postemp;

#if MACHINE == VAXVMS
    long ii;

#elif (MACHINE == ALPHAVMS) && (FLOATTYPE == GFLOAT)
    short *sptr;
    long ii;

#endif


    if (incre == 4)      /* read all the values at once (contiguous bytes) */
    {
        if (nvals * 4 < MINDIRECT)  /* read normally via IO buffers */
        {
           ffmbyt(fptr, byteloc, REPORT_EOF, status);
           ffgbyt(fptr, nvals * 4, values, status);
        }
        else            /* read directly from disk, bypassing IO buffers */
        {
           postemp = (fptr->Fptr)->bytepos;   /* store current file position */
           (fptr->Fptr)->bytepos = byteloc;   /* set to the desired position */
           ffgbyt(fptr, nvals * 4, values, status);
           (fptr->Fptr)->bytepos = postemp;   /* reset to original position */
        }
    }
    else         /* have to read each value individually (not contiguous ) */
    {
        ffmbyt(fptr, byteloc, REPORT_EOF, status);
        ffgbytoff(fptr, 4, nvals, incre - 4, values, status);
    }


#if MACHINE == VAXVMS

    ii = nvals;                      /* call VAX macro routine to convert */
    ieevur(values, values, &ii);     /* from  IEEE float -> F float       */

#elif (MACHINE == ALPHAVMS) && (FLOATTYPE == GFLOAT)

    ffswap2( (short *) values, nvals * 2);  /* swap pairs of bytes */

    /* convert from IEEE float format to VMS GFLOAT float format */
    sptr = (short *) values;
    for (ii = 0; ii < nvals; ii++, sptr += 2)
    {
        if (!fnan(*sptr) )  /* test for NaN or underflow */
            values[ii] *= 4.0;
    }

#elif BYTESWAPPED
    ffswap4((INT32BIT *)values, nvals);  /* reverse order of bytes in values */
#endif

    return(*status);
}